

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O0

int tinsert(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  long local_30;
  lua_Integer i;
  lua_Integer pos;
  lua_Integer e;
  lua_State *L_local;
  
  checktab(L,1,7);
  lVar2 = luaL_len(L,1);
  local_30 = lVar2 + 1;
  iVar1 = lua_gettop(L);
  i = local_30;
  if (iVar1 != 2) {
    if (iVar1 != 3) {
      iVar1 = luaL_error(L,"wrong number of arguments to \'insert\'");
      return iVar1;
    }
    i = luaL_checkinteger(L,2);
    if ((i < 1) || (local_30 < i)) {
      luaL_argerror(L,2,"position out of bounds");
    }
    for (; i < local_30; local_30 = local_30 + -1) {
      lua_geti(L,1,local_30 + -1);
      lua_seti(L,1,local_30);
    }
  }
  lua_seti(L,1,i);
  return 0;
}

Assistant:

static int tinsert(lua_State *L) {
    lua_Integer e = aux_getn(L, 1, TAB_RW) + 1;  /* first empty element */
    lua_Integer pos;  /* where to insert new element */
    switch (lua_gettop(L)) {
        case 2: {  /* called with only 2 arguments */
            pos = e;  /* insert new element at the end */
            break;
        }
        case 3: {
            lua_Integer i;
            pos = luaL_checkinteger(L, 2);  /* 2nd argument is the position */
            luaL_argcheck(L, 1 <= pos && pos <= e, 2, "position out of bounds");
            for (i = e; i > pos; i--) {  /* move up elements */
                lua_geti(L, 1, i - 1);
                lua_seti(L, 1, i);  /* t[i] = t[i - 1] */
            }
            break;
        }
        default: {
            return luaL_error(L, "wrong number of arguments to 'insert'");
        }
    }
    lua_seti(L, 1, pos);  /* t[pos] = v */
    return 0;
}